

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

void __thiscall CTPNObjProp::gen_code_inline_obj(CTPNObjProp *this)

{
  int iVar1;
  CTPNAnonFunc *pCVar2;
  CTcPrsNode *pCVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  CTcTokenizer *pCVar7;
  CTcGenTarg *pCVar8;
  int iVar9;
  
  pCVar7 = G_tok;
  uVar4 = *(undefined4 *)
           ((long)&(this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.file_ + 4);
  lVar6 = (this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.linenum_;
  uVar5 = *(undefined4 *)
           ((long)&(this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.linenum_ + 4);
  *(undefined4 *)&G_tok->last_desc_ =
       *(undefined4 *)&(this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.file_;
  *(undefined4 *)((long)&pCVar7->last_desc_ + 4) = uVar4;
  *(int *)&pCVar7->last_linenum_ = (int)lVar6;
  *(undefined4 *)((long)&pCVar7->last_linenum_ + 4) = uVar5;
  pCVar2 = (this->super_CTPNObjPropBase).inline_method_;
  if (pCVar2 != (CTPNAnonFunc *)0x0) {
    (**(pCVar2->super_CTPNAnonFuncBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
              (pCVar2,0,0);
LAB_0021b0bb:
    gen_setMethod(this);
    return;
  }
  pCVar3 = (this->super_CTPNObjPropBase).expr_;
  if (pCVar3 != (CTcPrsNode *)0x0) {
    iVar9 = (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[7])();
    if (iVar9 != 0) {
      pCVar3 = (this->super_CTPNObjPropBase).expr_;
      CTPNConst::s_gen_code_str
                ((char *)pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase,
                 (size_t)pCVar3[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase);
      goto LAB_0021b0bb;
    }
    CTcGenTarg::write_op(G_cg,0x88);
    pCVar8 = G_cg;
    iVar1 = G_cg->sp_depth_;
    iVar9 = iVar1 + 1;
    G_cg->sp_depth_ = iVar9;
    if (pCVar8->max_sp_depth_ <= iVar1) {
      pCVar8->max_sp_depth_ = iVar9;
    }
    pCVar3 = (this->super_CTPNObjPropBase).expr_;
    (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,0,0);
    iVar9 = (*(((this->super_CTPNObjPropBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[10]
            )();
    if (iVar9 == 0) {
      CTcGenTarg::write_op(G_cg,'\b');
      pCVar8 = G_cg;
      iVar1 = G_cg->sp_depth_;
      iVar9 = iVar1 + 1;
      G_cg->sp_depth_ = iVar9;
      if (pCVar8->max_sp_depth_ <= iVar1) {
        pCVar8->max_sp_depth_ = iVar9;
      }
    }
    CTcGenTarg::write_op(G_cg,0x8d);
    CTcGenTarg::write_op(G_cg,0xe5);
    CTcDataStream::write_prop_id
              (&G_cs->super_CTcDataStream,
               (uint)(((this->super_CTPNObjPropBase).prop_sym_)->super_CTcSymPropBase).prop_);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -2;
  }
  return;
}

Assistant:

void CTPNObjProp::gen_code_inline_obj()
{
    /* set the current source location for error reporting */
    G_tok->set_line_info(file_, linenum_);

    /* generate code for our expression or our code body, as appropriate */
    if (inline_method_ != 0)
    {
        /* 
         *   Code as an in-line method.  This means that the code was
         *   specified as an explicit method in braces; we compile it as an
         *   anonymous method so that it can access locals in enclosing
         *   scopes.  Generate the code to construct the closure object, then
         *   call obj.setMethod(prop, anonMethod) to bind it as a method of
         *   the object.  This will make it act like a regular method, in
         *   that evaluating the property will call the method.
         */
        inline_method_->gen_code(FALSE, FALSE);

        /* generate the setMethod */
        gen_setMethod();
    }
    else if (expr_ != 0)
    {
        /* check the type of expression */
        if (expr_->is_dstring())
        {
            /* 
             *   Double-quoted string - generate obj.setMethod(prop, string)
             */
            
            /* push the string contents as a regular sstring constant */
            CTPNDstr *dstr = (CTPNDstr *)expr_;
            CTPNConst::s_gen_code_str(dstr->get_str(), dstr->get_str_len());
            
            /* get the setMethod property */
            gen_setMethod();
        }
        else
        {
            /*
             *   Expression, constant or live.  Generate the code to evaluate
             *   the expression; this runs at the moment of evaluating the
             *   overall inline object expression, so we caputre the value of
             *   the expression at the time we create the inline object
             *   instance (and fix the value at that point - this isn't a
             *   method that's invoked when the property is evaluated).
             */
            
            /* push the new object referene */
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();

            /* it's a constant value - do a setprop; start with my value */
            expr_->gen_code(FALSE, FALSE);

            /* if it doesn't have a return value, set the property to nil */
            if (!expr_->has_return_value())
            {
                G_cg->write_op(OPC_PUSHNIL);
                G_cg->note_push();
            }

            /* get the object and value into the proper order */
            G_cg->write_op(OPC_SWAP);

            /* generate the setprop for <obj>.<prop> = <value> */
            G_cg->write_op(OPC_SETPROP);
            G_cs->write_prop_id(prop_sym_->get_prop());
            G_cg->note_pop(2);
        }
    }
}